

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O2

int ipc_get_peer_uid(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int local_30;
  int local_2c;
  int ignore;
  int id;
  
  local_2c = 0;
  iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  iVar1 = nni_posix_peerid(iVar1,&local_2c,&local_30,&local_30,&local_30);
  if (iVar1 == 0) {
    iVar1 = nni_copyout_int(local_2c,buf,szp,t);
  }
  return iVar1;
}

Assistant:

static int
ipc_get_peer_uid(void *arg, void *buf, size_t *szp, nni_type t)
{
	ipc_conn *c = arg;
	int       rv;
	int       ignore;
	int       id = 0;

	if ((rv = nni_posix_peerid(nni_posix_pfd_fd(&c->pfd), &id, &ignore,
	         &ignore, &ignore)) != 0) {
		return (rv);
	}
	return (nni_copyout_int(id, buf, szp, t));
}